

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::MethodDescriptor::GetSourceLocation
          (MethodDescriptor *this,SourceLocation *out_location)

{
  bool bVar1;
  ServiceDescriptor *this_00;
  FileDescriptor *this_01;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> path;
  SourceLocation *out_location_local;
  MethodDescriptor *this_local;
  
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &out_location->start_line;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_30);
  GetLocationPath(this,(vector<int,_std::allocator<int>_> *)local_30);
  this_00 = service(this);
  this_01 = ServiceDescriptor::file(this_00);
  bVar1 = FileDescriptor::GetSourceLocation
                    (this_01,(vector<int,_std::allocator<int>_> *)local_30,
                     (SourceLocation *)
                     path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return bVar1;
}

Assistant:

bool MethodDescriptor::GetSourceLocation(SourceLocation* out_location) const {
  vector<int> path;
  GetLocationPath(&path);
  return service()->file()->GetSourceLocation(path, out_location);
}